

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

bool ImPlot::BeginDragDropSourceY
               (ImPlotYAxis axis,ImGuiKeyModFlags key_mods,ImGuiDragDropFlags flags)

{
  bool bVar1;
  ImGuiIO *pIVar2;
  bool local_29;
  undefined1 local_28 [8];
  ImRect rect;
  ImGuiID ID;
  ImGuiDragDropFlags flags_local;
  ImGuiKeyModFlags key_mods_local;
  ImPlotYAxis axis_local;
  
  rect.Max.y = (float)flags;
  pIVar2 = ImGui::GetIO();
  if (pIVar2->KeyMods == key_mods) {
    GImPlot->CurrentPlot->YAxis[axis].Dragging = false;
  }
  rect.Max.x = (float)ImGuiWindow::GetID(GImGui->CurrentWindow,axis + 0x990f41);
  local_28 = *(undefined1 (*) [8])&GImPlot->CurrentPlot->YAxis[axis].HoverRect.Min;
  rect.Min = GImPlot->CurrentPlot->YAxis[axis].HoverRect.Max;
  bVar1 = ImGui::ItemAdd((ImRect *)local_28,(ImGuiID)rect.Max.x,(ImRect *)local_28,0);
  local_29 = false;
  if (bVar1) {
    local_29 = BeginDragDropSourceEx
                         ((ImGuiID)rect.Max.x,
                          (bool)(GImPlot->CurrentPlot->YAxis[axis].ExtHovered & 1),
                          (ImGuiDragDropFlags)rect.Max.y,key_mods);
  }
  return local_29;
}

Assistant:

bool BeginDragDropSourceY(ImPlotYAxis axis, ImGuiKeyModFlags key_mods, ImGuiDragDropFlags flags) {
    if (ImGui::GetIO().KeyMods == key_mods)
        GImPlot->CurrentPlot->YAxis[axis].Dragging = false;
    const ImGuiID ID = GImGui->CurrentWindow->GetID(IMPLOT_ID_YAX + axis);
    ImRect rect = GImPlot->CurrentPlot->YAxis[axis].HoverRect;
    return  ImGui::ItemAdd(rect, ID, &rect) && BeginDragDropSourceEx(ID, GImPlot->CurrentPlot->YAxis[axis].ExtHovered, flags, key_mods);
}